

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

string * __thiscall
wasm::Pass::getArgumentOrDefault
          (string *__return_storage_ptr__,Pass *this,string *key,string *defaultValue)

{
  __type_conflict _Var1;
  PassOptions *this_00;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *defaultValue_local;
  string *key_local;
  Pass *this_local;
  
  local_28 = defaultValue;
  defaultValue_local = key;
  key_local = (string *)this;
  this_local = (Pass *)__return_storage_ptr__;
  _Var1 = std::operator==(key,&this->name);
  if (_Var1) {
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
              (__return_storage_ptr__,(optional<std::__cxx11::string> *)&this->passArg,local_28);
  }
  else {
    this_00 = getPassOptions(this);
    std::__cxx11::string::string((string *)&local_48,(string *)defaultValue_local);
    std::__cxx11::string::string((string *)&local_68,(string *)local_28);
    PassOptions::getArgumentOrDefault(__return_storage_ptr__,this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pass::getArgumentOrDefault(const std::string& key,
                                       const std::string& defaultValue) {
  if (key == name) {
    return passArg.value_or(defaultValue);
  }

  return getPassOptions().getArgumentOrDefault(key, defaultValue);
}